

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cpp
# Opt level: O3

void readtestfile(char *data_file)

{
  int *piVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  iterator iVar8;
  vector<double,_std::allocator<double>_> *pvVar9;
  long lVar10;
  char buff [200000];
  vector<double,_std::allocator<double>_> vStack_30da8;
  int iStack_30d8c;
  FILE *pFStack_30d88;
  void *pvStack_30d80;
  char acStack_30d78 [200008];
  
  pFStack_30d88 = fopen(data_file,"r");
  if (0 < test_n) {
    iVar7 = 0;
    do {
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)&test_x,&vStack_30da8);
      if (vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
                  *)&test_y,&vStack_30da8);
      if (vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < test_n);
  }
  iVar7 = test_n;
  uVar5 = 0xffffffffffffffff;
  if (-1 < test_n) {
    uVar5 = (long)test_n * 4;
  }
  pvVar3 = operator_new__(uVar5);
  if (0 < iVar7) {
    lVar10 = 0;
    iVar7 = 200000;
    pvStack_30d80 = pvVar3;
    do {
      pvVar3 = pvStack_30d80;
      fgets(acStack_30d78,200000,pFStack_30d88);
      pcVar4 = strtok(acStack_30d78,", \r\n");
      iVar2 = atoi(pcVar4);
      *(int *)((long)pvVar3 + lVar10 * 4) = iVar2;
      iStack_30d8c = iVar7;
      if (iVar2 < iVar7) {
        iStack_30d8c = iVar2;
      }
      pcVar4 = strtok((char *)0x0,", \r\n");
      if (0 < ts_len) {
        iVar7 = 0;
        do {
          pvVar9 = test_x.
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar10;
          vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)atof(pcVar4);
          iVar8._M_current =
               (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar8._M_current ==
              (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (pvVar9,iVar8,(double *)&vStack_30da8);
          }
          else {
            *iVar8._M_current =
                 (double)vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
            (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar8._M_current + 1;
          }
          pcVar4 = strtok((char *)0x0,", \r\n");
          iVar7 = iVar7 + 1;
        } while (iVar7 < ts_len);
      }
      iVar2 = test_n;
      lVar10 = lVar10 + 1;
      uVar5 = (ulong)test_n;
      iVar7 = iStack_30d8c;
    } while (lVar10 < (long)uVar5);
    pvVar3 = pvStack_30d80;
    if (0 < test_n) {
      uVar6 = 0;
      do {
        piVar1 = (int *)((long)pvStack_30d80 + uVar6 * 4);
        *piVar1 = *piVar1 - iStack_30d8c;
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
      if (0 < iVar2) {
        lVar10 = 0;
        iVar7 = num_c;
        do {
          if (0 < iVar7) {
            iVar7 = *(int *)((long)pvVar3 + lVar10 * 4);
            iVar2 = 0;
            do {
              pvVar9 = test_y.
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar10;
              if (iVar7 == iVar2) {
                vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x3ff0000000000000;
                iVar8._M_current =
                     (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar8._M_current !=
                    (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  *iVar8._M_current = 1.0;
                  goto LAB_00101798;
                }
LAB_001017a2:
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (pvVar9,iVar8,(double *)&vStack_30da8);
              }
              else {
                vStack_30da8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                iVar8._M_current =
                     (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar8._M_current ==
                    (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) goto LAB_001017a2;
                *iVar8._M_current = 0.0;
LAB_00101798:
                (pvVar9->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar8._M_current + 1;
              }
              iVar2 = iVar2 + 1;
            } while (iVar2 < num_c);
            uVar5 = (ulong)(uint)test_n;
            pvVar3 = pvStack_30d80;
            iVar7 = num_c;
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 < (int)uVar5);
      }
    }
  }
  operator_delete__(pvVar3);
  fclose(pFStack_30d88);
  return;
}

Assistant:

void readtestfile(char *data_file) {
    FILE *f;
    f = fopen(data_file, "r");

    char buff[MAX_CHAR_PER_LINE];
    char *tmp;

    for (int i = 0; i < test_n; ++i) {
        test_x.push_back(vector<double>());
        test_y.push_back(vector<double>());
    }

    int *label = new int[test_n];
    int min_c = MAX_CHAR_PER_LINE;

    for (int i = 0; i < test_n; i++) {
        fgets(buff, MAX_CHAR_PER_LINE, f);
        tmp = strtok(buff, ", \r\n");

        label[i] = atoi(tmp);
        min_c = min(min_c, label[i]);

        tmp = strtok(NULL, ", \r\n");
        for (int j = 0; j < ts_len; ++j) {
            test_x[i].push_back(atof(tmp));
            tmp = strtok(NULL, ", \r\n");
        }
    }

    for (int i = 0; i < test_n; ++i) {
        label[i] -= min_c;
    }

    /**
     * label(xi) = a => y = {0 .... 1 .... 0}
     *                              ^
     *                              a position
     */
    for (int i = 0; i < test_n; ++i) {
        for (int j = 0; j < num_c; ++j) {
            if (j == label[i]) {
                test_y[i].push_back(1.0);
            } else {
                test_y[i].push_back(0.0);
            }
        }
    }

    delete[] label;

    fclose(f);
}